

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cc
# Opt level: O2

void __thiscall phosg::Image::save(Image *this,string *filename,Format format)

{
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> f;
  allocator<char> local_49;
  unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)> local_48;
  string local_38;
  
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"wb",&local_49);
  fopen_unique((phosg *)&local_48,(string *)filename,&local_38,(FILE *)0x0);
  ::std::__cxx11::string::~string((string *)&local_38);
  save(this,local_48._M_t.super___uniq_ptr_impl<_IO_FILE,_void_(*)(_IO_FILE_*)>._M_t.
            super__Tuple_impl<0UL,__IO_FILE_*,_void_(*)(_IO_FILE_*)>.
            super__Head_base<0UL,__IO_FILE_*,_false>._M_head_impl,format);
  ::std::unique_ptr<_IO_FILE,_void_(*)(_IO_FILE_*)>::~unique_ptr(&local_48);
  return;
}

Assistant:

void Image::save(const string& filename, Format format) const {
  auto f = fopen_unique(filename, "wb");
  this->save(f.get(), format);
}